

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O2

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
jbcoin::STTx::checkSign_abi_cxx11_
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,STTx *this,bool allowMultiSign)

{
  undefined7 in_register_00000011;
  undefined1 local_60 [40];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_60[0] = false;
  std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<bool,_const_char_(&)[1],_true>(__return_storage_ptr__,(bool *)local_60,(char (*) [1])"");
  if ((int)CONCAT71(in_register_00000011,allowMultiSign) == 0) {
    checkSingleSign_abi_cxx11_
              ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_60,this);
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(__return_storage_ptr__,(type)local_60);
    std::__cxx11::string::~string((string *)(local_60 + 8));
  }
  else {
    STObject::getFieldVL((Blob *)&local_38,&this->super_STObject,(SField *)sfSigningPubKey);
    if (local_38._M_impl.super__Vector_impl_data._M_start ==
        local_38._M_impl.super__Vector_impl_data._M_finish) {
      checkMultiSign_abi_cxx11_
                ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_60,this);
    }
    else {
      checkSingleSign_abi_cxx11_
                ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_60,this);
    }
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(__return_storage_ptr__,(type)local_60);
    std::__cxx11::string::~string((string *)(local_60 + 8));
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> STTx::checkSign(bool allowMultiSign) const
{
    std::pair<bool, std::string> ret {false, ""};
    try
    {
        if (allowMultiSign)
        {
            // Determine whether we're single- or multi-signing by looking
            // at the SigningPubKey.  It it's empty we must be
            // multi-signing.  Otherwise we're single-signing.
            Blob const& signingPubKey = getFieldVL (sfSigningPubKey);
            ret = signingPubKey.empty () ?
                checkMultiSign () : checkSingleSign ();
        }
        else
        {
            ret = checkSingleSign ();
        }
    }
    catch (std::exception const&)
    {
        ret = {false, "Internal signature check failure."};
    }
    return ret;
}